

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall duckdb_re2::Regexp::ParseState::PushRegexp(ParseState *this,Regexp *re)

{
  CharClassBuilder *pCVar1;
  bool bVar2;
  _Rb_tree_color _Var3;
  
  MaybeConcatString(this,-1,NoParseFlags);
  if ((re->op_ != '\x14') ||
     (pCVar1 = (re->arguments).char_class.ccb_, pCVar1 == (CharClassBuilder *)0x0))
  goto LAB_018609d5;
  CharClassBuilder::RemoveAbove(pCVar1,this->rune_max_);
  pCVar1 = (re->arguments).char_class.ccb_;
  if (pCVar1->nrunes_ == 2) {
    _Var3 = (pCVar1->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
    if (0x19 < _Var3 - 0x41) goto LAB_018609d5;
    _Var3 = _Var3 | 0x20;
    bVar2 = CharClassBuilder::Contains(pCVar1,_Var3);
    if (!bVar2) goto LAB_018609d5;
    Decref(re);
    re = (Regexp *)operator_new(0x28);
    Regexp(re,kRegexpLiteral,this->flags_ | FoldCase);
  }
  else {
    if (pCVar1->nrunes_ != 1) goto LAB_018609d5;
    _Var3 = (pCVar1->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
    Decref(re);
    re = (Regexp *)operator_new(0x28);
    Regexp(re,kRegexpLiteral,this->flags_);
  }
  (re->arguments).repeat.max_ = _Var3;
LAB_018609d5:
  if (re->op_ < 0x16) {
    bVar2 = ComputeSimple(re);
    re->simple_ = bVar2;
  }
  re->down_ = this->stacktop_;
  this->stacktop_ = re;
  return true;
}

Assistant:

bool Regexp::ParseState::PushRegexp(Regexp* re) {
  MaybeConcatString(-1, NoParseFlags);

  // Special case: a character class of one character is just
  // a literal.  This is a common idiom for escaping
  // single characters (e.g., [.] instead of \.), and some
  // analysis does better with fewer character classes.
  // Similarly, [Aa] can be rewritten as a literal A with ASCII case folding.
  if (re->op_ == kRegexpCharClass && re->arguments.char_class.ccb_ != NULL) {
    re->arguments.char_class.ccb_->RemoveAbove(rune_max_);
    if (re->arguments.char_class.ccb_->size() == 1) {
      Rune r = re->arguments.char_class.ccb_->begin()->lo;
      re->Decref();
      re = new Regexp(kRegexpLiteral, flags_);
      re->arguments.rune_ = r;
    } else if (re->arguments.char_class.ccb_->size() == 2) {
      Rune r = re->arguments.char_class.ccb_->begin()->lo;
      if ('A' <= r && r <= 'Z' && re->arguments.char_class.ccb_->Contains(r + 'a' - 'A')) {
        re->Decref();
        re = new Regexp(kRegexpLiteral, flags_ | FoldCase);
        re->arguments.rune_ = r + 'a' - 'A';
      }
    }
  }

  if (!IsMarker(re->op()))
    re->simple_ = re->ComputeSimple();
  re->down_ = stacktop_;
  stacktop_ = re;
  return true;
}